

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::~AsyncPipe(AsyncPipe *this)

{
  bool _kjCondition;
  Fault f;
  
  if (((this->state).ptr != (AsyncCapabilityStream *)0x0) &&
     (_kjCondition = (this->ownState).ptr != (AsyncCapabilityStream *)0x0, !_kjCondition)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[82]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xe9,FAILED,"state == kj::none || ownState.get() != nullptr",
               "_kjCondition,\"destroying AsyncPipe with operation still in-progress; probably going to segfault\""
               ,&_kjCondition,
               (char (*) [82])
               "destroying AsyncPipe with operation still in-progress; probably going to segfault");
    kj::_::Debug::Fault::~Fault(&f);
  }
  kj::_::NullableValue<kj::ForkedPromise<void>_>::~NullableValue(&(this->readAbortPromise).ptr);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->readAbortFulfiller).ptr);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&this->ownState);
  Refcounted::~Refcounted(&this->super_Refcounted);
  AsyncIoStream::~AsyncIoStream((AsyncIoStream *)this);
  return;
}

Assistant:

~AsyncPipe() noexcept(false) {
    KJ_REQUIRE(state == kj::none || ownState.get() != nullptr,
        "destroying AsyncPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }